

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
bssl::der::test::ParserTest_IncompleteEncodingLengthTruncated_Test::TestBody
          (ParserTest_IncompleteEncodingLengthTruncated_Test *this)

{
  bool bVar1;
  char *in_R9;
  Input input;
  uint8_t der [2];
  CBS_ASN1_TAG tag;
  Parser parser;
  Input value;
  AssertHelper local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  uchar local_6a [2];
  string local_68;
  CBS_ASN1_TAG local_44;
  Parser local_40;
  Input local_28;
  
  local_6a[0] = '\x04';
  local_6a[1] = 0x81;
  input.data_.size_ = 2;
  input.data_.data_ = local_6a;
  Parser::Parser(&local_40,input);
  local_28.data_.data_ = (uchar *)0x0;
  local_28.data_.size_ = 0;
  bVar1 = Parser::ReadTagAndValue(&local_40,&local_44,&local_28);
  local_80[0] = (internal)!bVar1;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_80[0]) {
    local_80[0] = (internal)Parser::HasMore(&local_40);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_80[0]) {
      return;
    }
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_80,(AssertionResult *)"parser.HasMore()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
               ,0x114,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
  }
  else {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_80,(AssertionResult *)"parser.ReadTagAndValue(&tag, &value)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
               ,0x113,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  return;
}

Assistant:

TEST(ParserTest, IncompleteEncodingLengthTruncated) {
  // Tag: octet string; length: long form, should have 2 total octets, but
  // the last one is missing. (There's also no value.)
  const uint8_t der[] = {0x04, 0x81};
  Parser parser((Input(der)));

  CBS_ASN1_TAG tag;
  Input value;
  ASSERT_FALSE(parser.ReadTagAndValue(&tag, &value));
  ASSERT_TRUE(parser.HasMore());
}